

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

archive_vtable_conflict * archive_read_disk_vtable(void)

{
  if (archive_read_disk_vtable::inited == L'\0') {
    archive_read_disk_vtable::av.archive_free = _archive_read_free;
    archive_read_disk_vtable::av.archive_close = _archive_read_close;
    archive_read_disk_vtable::av.archive_read_data_block = _archive_read_data_block;
    archive_read_disk_vtable::av.archive_read_next_header = _archive_read_next_header;
    archive_read_disk_vtable::av.archive_read_next_header2 = _archive_read_next_header2;
    archive_read_disk_vtable::inited = L'\x01';
  }
  return &archive_read_disk_vtable::av;
}

Assistant:

static struct archive_vtable *
archive_read_disk_vtable(void)
{
	static struct archive_vtable av;
	static int inited = 0;

	if (!inited) {
		av.archive_free = _archive_read_free;
		av.archive_close = _archive_read_close;
		av.archive_read_data_block = _archive_read_data_block;
		av.archive_read_next_header = _archive_read_next_header;
		av.archive_read_next_header2 = _archive_read_next_header2;
		inited = 1;
	}
	return (&av);
}